

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::RE2::Extract(StringPiece *text,RE2 *re,StringPiece *rewrite,string *out)

{
  bool bVar1;
  int iVar2;
  StringPiece *in_RDI;
  int nvec;
  StringPiece vec [17];
  int in_stack_0000023c;
  StringPiece *in_stack_00000240;
  StringPiece *in_stack_00000248;
  string *in_stack_00000250;
  RE2 *in_stack_00000258;
  StringPiece *in_stack_00000ed0;
  Anchor in_stack_00000edc;
  size_t in_stack_00000ee0;
  size_t in_stack_00000ee8;
  StringPiece *in_stack_00000ef0;
  RE2 *in_stack_00000ef8;
  int in_stack_00000f10;
  StringPiece *rewrite_00;
  StringPiece *local_148;
  StringPiece local_138 [17];
  StringPiece local_28;
  StringPiece *local_10;
  bool local_1;
  
  local_148 = local_138;
  rewrite_00 = &local_28;
  local_10 = in_RDI;
  do {
    StringPiece::StringPiece(local_148);
    local_148 = local_148 + 1;
  } while (local_148 != rewrite_00);
  iVar2 = MaxSubmatch(rewrite_00);
  if (iVar2 + 1 < 0x12) {
    StringPiece::size(local_10);
    bVar1 = Match(in_stack_00000ef8,in_stack_00000ef0,in_stack_00000ee8,in_stack_00000ee0,
                  in_stack_00000edc,in_stack_00000ed0,in_stack_00000f10);
    if (bVar1) {
      std::__cxx11::string::clear();
      local_1 = Rewrite(in_stack_00000258,in_stack_00000250,in_stack_00000248,in_stack_00000240,
                        in_stack_0000023c);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RE2::Extract(const StringPiece& text,
                  const RE2& re,
                  const StringPiece& rewrite,
                  std::string* out) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > static_cast<int>(arraysize(vec)))
    return false;

  if (!re.Match(text, 0, text.size(), UNANCHORED, vec, nvec))
    return false;

  out->clear();
  return re.Rewrite(out, rewrite, vec, nvec);
}